

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Int16_To_Float32(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                     int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  PaInt16 *src;
  float *dest;
  
  if (count != 0) {
    do {
      *(float *)destinationBuffer = (float)(int)*sourceBuffer * 3.0517578e-05;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 2);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Int16_To_Float32(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt16 *src = (PaInt16*)sourceBuffer;
    float *dest =  (float*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        float samp = *src * const_1_div_32768_; /* FIXME: i'm concerned about this being asymmetrical with float->int16 -rb */
        *dest = samp;

        src += sourceStride;
        dest += destinationStride;
    }
}